

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void callFinaliser(sqlite3 *db,int offset)

{
  VTable *pVTab;
  code *pcVar1;
  long lVar2;
  
  if (db->aVTrans != (VTable **)0x0) {
    if (0 < db->nVTrans) {
      lVar2 = 0;
      do {
        pVTab = db->aVTrans[lVar2];
        if ((pVTab->pVtab != (sqlite3_vtab *)0x0) &&
           (pcVar1 = *(code **)((long)&pVTab->pVtab->pModule->iVersion + (ulong)(uint)offset),
           pcVar1 != (code *)0x0)) {
          (*pcVar1)();
        }
        pVTab->iSavepoint = 0;
        sqlite3VtabUnlock(pVTab);
        lVar2 = lVar2 + 1;
      } while (lVar2 < db->nVTrans);
    }
    sqlite3DbFree(db,db->aVTrans);
    db->nVTrans = 0;
    db->aVTrans = (VTable **)0x0;
  }
  return;
}

Assistant:

static void callFinaliser(sqlite3 *db, int offset){
  int i;
  if( db->aVTrans ){
    for(i=0; i<db->nVTrans; i++){
      VTable *pVTab = db->aVTrans[i];
      sqlite3_vtab *p = pVTab->pVtab;
      if( p ){
        int (*x)(sqlite3_vtab *);
        x = *(int (**)(sqlite3_vtab *))((char *)p->pModule + offset);
        if( x ) x(p);
      }
      pVTab->iSavepoint = 0;
      sqlite3VtabUnlock(pVTab);
    }
    sqlite3DbFree(db, db->aVTrans);
    db->nVTrans = 0;
    db->aVTrans = 0;
  }
}